

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

void get_txb_dimensions(MACROBLOCKD *xd,int plane,BLOCK_SIZE plane_bsize,int blk_row,int blk_col,
                       BLOCK_SIZE tx_bsize,int *width,int *height,int *visible_width,
                       int *visible_height)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_00000084;
  undefined7 in_register_00000089;
  
  uVar3 = (uint)block_size_high[(uint)blk_row];
  if (xd->mb_to_bottom_edge < 0) {
    uVar2 = (xd->mb_to_bottom_edge >> ((char)xd->plane[plane].subsampling_y + 3U & 0x1f)) +
            (uint)block_size_high[plane_bsize];
    if ((int)uVar2 < (int)(uint)block_size_high[(uint)blk_row]) {
      uVar3 = uVar2;
    }
    if ((int)uVar2 < 0) {
      uVar3 = 0;
    }
  }
  bVar1 = block_size_wide[(uint)blk_row];
  uVar2 = (uint)bVar1;
  *(uint *)CONCAT71(in_register_00000089,tx_bsize) = uVar3;
  if (xd->mb_to_right_edge < 0) {
    uVar3 = (xd->mb_to_right_edge >> ((char)xd->plane[plane].subsampling_x + 3U & 0x1f)) +
            (uint)block_size_wide[plane_bsize];
    if ((int)uVar3 < (int)(uint)bVar1) {
      uVar2 = uVar3;
    }
    if ((int)uVar3 < 0) {
      uVar2 = 0;
    }
  }
  *(uint *)CONCAT44(in_register_00000084,blk_col) = uVar2;
  return;
}

Assistant:

static inline void get_txb_dimensions(const MACROBLOCKD *xd, int plane,
                                      BLOCK_SIZE plane_bsize, int blk_row,
                                      int blk_col, BLOCK_SIZE tx_bsize,
                                      int *width, int *height,
                                      int *visible_width, int *visible_height) {
  assert(tx_bsize <= plane_bsize);
  const int txb_height = block_size_high[tx_bsize];
  const int txb_width = block_size_wide[tx_bsize];
  const struct macroblockd_plane *const pd = &xd->plane[plane];

  // TODO(aconverse@google.com): Investigate using crop_width/height here rather
  // than the MI size
  if (xd->mb_to_bottom_edge >= 0) {
    *visible_height = txb_height;
  } else {
    const int block_height = block_size_high[plane_bsize];
    const int block_rows =
        (xd->mb_to_bottom_edge >> (3 + pd->subsampling_y)) + block_height;
    *visible_height =
        clamp(block_rows - (blk_row << MI_SIZE_LOG2), 0, txb_height);
  }
  if (height) *height = txb_height;

  if (xd->mb_to_right_edge >= 0) {
    *visible_width = txb_width;
  } else {
    const int block_width = block_size_wide[plane_bsize];
    const int block_cols =
        (xd->mb_to_right_edge >> (3 + pd->subsampling_x)) + block_width;
    *visible_width =
        clamp(block_cols - (blk_col << MI_SIZE_LOG2), 0, txb_width);
  }
  if (width) *width = txb_width;
}